

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TryExpr::~TryExpr(TryExpr *this)

{
  TryExpr *this_local;
  
  (this->super_ExprMixin<(wabt::ExprType)56>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__TryExpr_0037b720;
  intrusive_list<wabt::Expr>::~intrusive_list(&this->catch_);
  Block::~Block(&this->block);
  ExprMixin<(wabt::ExprType)56>::~ExprMixin(&this->super_ExprMixin<(wabt::ExprType)56>);
  return;
}

Assistant:

explicit TryExpr(const Location& loc = Location())
      : ExprMixin<ExprType::Try>(loc) {}